

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::~GLES2ThreadedSharingTest(GLES2ThreadedSharingTest *this)

{
  GLES2ThreadedSharingTest *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2ThreadedSharingTest_03277af0;
  deinit(this);
  std::
  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
  ::~vector(&this->m_threads);
  egl::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

GLES2ThreadedSharingTest::~GLES2ThreadedSharingTest (void)
{
	GLES2ThreadedSharingTest::deinit();
}